

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::verify_assignments(Generator *top)

{
  undefined1 local_58 [8];
  VerifyAssignmentVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  VerifyAssignmentVisitor::VerifyAssignmentVisitor((VerifyAssignmentVisitor *)local_58);
  IRVisitor::visit_root_s
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  VerifyAssignmentVisitor::~VerifyAssignmentVisitor((VerifyAssignmentVisitor *)local_58);
  return;
}

Assistant:

void verify_assignments(Generator* top) {
    // verify the assignment width match, and sign as well
    VerifyAssignmentVisitor visitor;
    visitor.visit_root_s(top);
}